

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferAtomicFunctions::initTest(TextureBufferAtomicFunctions *this)

{
  uint uVar1;
  GLenum GVar2;
  code *pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  NotSupportedError *pNVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  reference pvVar12;
  TestError *this_00;
  char *local_78;
  char *csCode;
  string csSource;
  GLuint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data_buffer;
  GLint work_group_size;
  Functions *gl;
  TextureBufferAtomicFunctions *this_local;
  long lVar11;
  
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar9,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
               ,0x3f);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_shader_image_atomic_supported & 1U) == 0) {
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar9,"Shader image atomic functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
               ,0x44);
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar6 = (*pRVar10->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  (**(code **)(lVar11 + 0x860))
            (0x91bf,0,(undefined1 *)
                      ((long)&data_buffer.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x4c);
  this->m_n_texels_in_texture_buffer =
       data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  uVar1 = this->m_n_texels_in_texture_buffer;
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)(csSource.field_2._M_local_buf + 0xf));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(ulong)uVar1,
             (allocator<unsigned_int> *)(csSource.field_2._M_local_buf + 0xf));
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)(csSource.field_2._M_local_buf + 0xf));
  for (csSource.field_2._8_4_ = 0; uVar4 = csSource.field_2._8_4_,
      (uint)csSource.field_2._8_4_ < this->m_n_texels_in_texture_buffer;
      csSource.field_2._8_4_ = csSource.field_2._8_4_ + 1) {
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                         (ulong)(uint)csSource.field_2._8_4_);
    *pvVar12 = uVar4;
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_tbo_id);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x58);
  (**(code **)(lVar11 + 0x40))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error binding buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x5b);
  pcVar3 = *(code **)(lVar11 + 0x150);
  GVar2 = (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER;
  uVar1 = this->m_n_texels_in_texture_buffer;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
  (*pcVar3)(GVar2,(ulong)uVar1 << 2,pvVar12,0x88e8);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x5f);
  (**(code **)(lVar11 + 0x6f8))(1,&this->m_tbo_tex_id);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,99);
  (**(code **)(lVar11 + 8))(0x84c0);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x66);
  (**(code **)(lVar11 + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error binding texture object to GL_TEXTURE_BUFFER_EXT target!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x69);
  (**(code **)(lVar11 + 0x12f8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8236,this->m_tbo_id);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error setting buffer object as texture buffer\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x6c);
  GVar8 = (**(code **)(lVar11 + 0x3c8))();
  this->m_po_id = GVar8;
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x70);
  GVar8 = (**(code **)(lVar11 + 0x3f0))(0x91b9);
  this->m_cs_id = GVar8;
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
                  ,0x73);
  getComputeShaderCode_abi_cxx11_
            ((string *)&csCode,this,
             data_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  local_78 = (char *)std::__cxx11::string::c_str();
  bVar5 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_78,(bool *)0x0);
  if (!bVar5) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program object from valid compute shader object!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferAtomicFunctions.cpp"
               ,0x7a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string((string *)&csCode);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return;
}

Assistant:

void TextureBufferAtomicFunctions::initTest(void)
{
	/* Check if required extensions are supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (!m_is_shader_image_atomic_supported)
	{
		throw tcu::NotSupportedError(SHADER_IMAGE_ATOMIC_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint work_group_size = 0;
	gl.getIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &work_group_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_MAX_COMPUTE_WORK_GROUP_SIZE parameter value!");

	m_n_texels_in_texture_buffer = (glw::GLuint)work_group_size + 1;
	std::vector<glw::GLuint> data_buffer(m_n_texels_in_texture_buffer);

	for (glw::GLuint i = 0; i < m_n_texels_in_texture_buffer; ++i)
	{
		data_buffer[i] = i;
	}

	/* Create buffer object */
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_n_texels_in_texture_buffer * sizeof(glw::GLuint), &data_buffer[0],
				  GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	/* Initialize texture buffer */
	gl.genTextures(1, &m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to GL_TEXTURE_BUFFER_EXT target!");

	gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, GL_R32UI, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as texture buffer's data store!");

	/* Create program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode(work_group_size);
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program object from valid compute shader object!");
	}
}